

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

void __thiscall
kratos::InterfaceModPortDefinition::set_input(InterfaceModPortDefinition *this,string *name)

{
  uint uVar1;
  element_type *peVar2;
  __tuple_element_t<2UL,_tuple<unsigned_int,_vector<unsigned_int,_allocator<unsigned_int>_>,_PortDirection,_PortType>_>
  *p_Var3;
  UserException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_00;
  remove_reference_t<std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  string local_100;
  __tuple_element_t<2UL,_tuple<unsigned_int,_vector<unsigned_int,_allocator<unsigned_int>_>,_PortDirection,_PortType>_>
  local_dc;
  __tuple_element_t<2UL,_tuple<unsigned_int,_vector<unsigned_int,_allocator<unsigned_int>_>,_PortDirection,_PortType>_>
  dir;
  tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
  *local_b0;
  InterfacePortDef *port_def;
  string *name_local;
  InterfaceModPortDefinition *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  InterfacePortDef *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  port_def = (InterfacePortDef *)name;
  name_local = (string *)this;
  peVar2 = std::
           __shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->def_);
  uVar1 = (**(peVar2->super_IDefinition)._vptr_IDefinition)(peVar2,port_def);
  if ((uVar1 & 1) == 0) {
    peVar2 = std::
             __shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->def_);
    uVar1 = (*(peVar2->super_IDefinition)._vptr_IDefinition[1])(peVar2,port_def);
    if ((uVar1 & 1) != 0) {
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::emplace<std::__cxx11::string_const&>
                ((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                  *)&this->inputs_,port_def,__args_00);
    }
  }
  else {
    peVar2 = std::
             __shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->def_);
    (*(peVar2->super_IDefinition)._vptr_IDefinition[2])(&stack0xffffffffffffff28,peVar2,port_def);
    local_b0 = (tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                *)&stack0xffffffffffffff28;
    p_Var3 = std::
             get<2ul,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,kratos::PortDirection,kratos::PortType>
                       (local_b0);
    local_dc = *p_Var3;
    if (local_dc != In) {
      this_00 = (UserException *)__cxa_allocate_exception(0x10);
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&this->name_;
      local_38 = &local_100;
      local_40 = "{0} is not declared as an input but is used as one in {1}";
      local_48 = port_def;
      fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string&,char[58],char>
                (&local_78,(v7 *)"{0} is not declared as an input but is used as one in {1}",
                 (char (*) [58])port_def,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
      local_58 = &local_78;
      local_88 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_30 = local_58;
      local_20 = local_58;
      local_10 = local_58;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_58);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_90.values_;
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_88.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_100,(detail *)local_88.data_,format_str,args);
      UserException::UserException(this_00,&local_100);
      __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
    }
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    emplace<std::__cxx11::string_const&>
              ((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                *)&this->inputs_,port_def,__args);
    std::
    tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
    ::~tuple((tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
              *)&stack0xffffffffffffff28);
  }
  return;
}

Assistant:

void InterfaceModPortDefinition::set_input(const std::string& name) {
    if (def_->has_port(name)) {
        // this is a port
        auto const& port_def = def_->port(name);
        auto dir = std::get<2>(port_def);
        if (dir != PortDirection::In) {
            throw UserException(
                ::format("{0} is not declared as an input but is used as one in {1}", name, name_));
        }
        inputs_.emplace(name);
    } else if (def_->has_var(name)) {
        // this is a variable
        inputs_.emplace(name);
    }
}